

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalMap.h
# Opt level: O3

IntervalMap<unsigned_long,_std::monostate,_3U> * __thiscall
slang::IntervalMap<unsigned_long,_std::monostate,_3U>::intersection
          (IntervalMap<unsigned_long,_std::monostate,_3U> *__return_storage_ptr__,
          IntervalMap<unsigned_long,_std::monostate,_3U> *this,
          IntervalMap<unsigned_long,_std::monostate,_3U> *other,allocator_type *alloc)

{
  void *pvVar1;
  ulong uVar2;
  ulong uVar3;
  bool bVar4;
  long lVar5;
  ulong uVar6;
  ulong left;
  const_iterator *pcVar7;
  long lVar8;
  const_iterator lit;
  const_iterator rit;
  const_iterator rend;
  const_iterator lend;
  const_iterator local_130;
  const_iterator local_f0;
  const_iterator local_b0;
  const_iterator local_70;
  
  __return_storage_ptr__->height = 0;
  __return_storage_ptr__->rootSize = 0;
  begin(&local_130,this);
  begin(&local_f0,other);
  end(&local_70,this);
  end(&local_b0,other);
  while( true ) {
    bVar4 = IntervalMapDetails::Path::operator==(&local_130.path,&local_70.path);
    if (bVar4) break;
    bVar4 = IntervalMapDetails::Path::operator==(&local_f0.path,&local_b0.path);
    if (bVar4) break;
    pvVar1 = local_130.path.path.super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_
             [local_130.path.path.super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len
              - 1].node;
    lVar5 = (ulong)local_130.path.path.super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>
                   .data_[local_130.path.path.
                          super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len - 1].
                   offset * 0x10;
    uVar2 = *(ulong *)((long)pvVar1 + lVar5 + 8);
    lVar8 = (ulong)local_f0.path.path.super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.
                   data_[local_f0.path.path.
                         super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len - 1].
                   offset * 0x10;
    left = *(ulong *)((long)local_f0.path.path.
                            super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_
                            [local_f0.path.path.
                             super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len - 1].
                            node + lVar8);
    pcVar7 = &local_130;
    if (uVar2 < left) {
LAB_0061b006:
      const_iterator::operator++(pcVar7);
    }
    else {
      uVar6 = *(ulong *)((long)pvVar1 + lVar5);
      uVar3 = *(ulong *)((long)local_f0.path.path.
                               super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_
                               [local_f0.path.path.
                                super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len -
                                1].node + lVar8 + 8);
      pcVar7 = &local_f0;
      if (uVar3 < uVar6) goto LAB_0061b006;
      if (left < uVar6) {
        left = uVar6;
      }
      uVar6 = uVar2;
      if (uVar3 < uVar2) {
        uVar6 = uVar3;
      }
      unionWith(__return_storage_ptr__,left,uVar6,
                (monostate *)
                ((long)pvVar1 +
                (ulong)local_130.path.path.
                       super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_
                       [local_130.path.path.
                        super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len - 1].
                       offset + (ulong)((local_130.map)->height != 0) * 0x80 + 0x30),alloc);
      pcVar7 = &local_f0;
      if (uVar2 < uVar3) {
        pcVar7 = &local_130;
      }
      const_iterator::operator++(pcVar7);
    }
  }
  if (local_b0.path.path.super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_ !=
      (pointer)local_b0.path.path.super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.
               firstElement) {
    operator_delete(local_b0.path.path.super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>
                    .data_);
  }
  if (local_70.path.path.super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_ !=
      (pointer)local_70.path.path.super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.
               firstElement) {
    operator_delete(local_70.path.path.super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>
                    .data_);
  }
  if (local_f0.path.path.super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_ !=
      (pointer)local_f0.path.path.super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.
               firstElement) {
    operator_delete(local_f0.path.path.super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>
                    .data_);
  }
  if (local_130.path.path.super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_ !=
      (pointer)local_130.path.path.super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.
               firstElement) {
    operator_delete(local_130.path.path.
                    super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_);
  }
  return __return_storage_ptr__;
}

Assistant:

IntervalMap<TKey, TValue, N> IntervalMap<TKey, TValue, N>::intersection(
    const IntervalMap& other, allocator_type& alloc) const {

    IntervalMap result;
    auto lit = begin(), rit = other.begin();
    auto lend = end(), rend = other.end();
    while (lit != lend && rit != rend) {
        auto lkey = lit.bounds(), rkey = rit.bounds();
        if (lkey.second < rkey.first) {
            ++lit;
        }
        else if (rkey.second < lkey.first) {
            ++rit;
        }
        else {
            // We will arbitrarily take the left hand value,
            // since there's no way to merge them. Presumably if
            // this method is being called the values don't matter.
            auto left = std::max(lkey.first, rkey.first);
            auto right = std::min(lkey.second, rkey.second);
            result.unionWith(left, right, *lit, alloc);

            if (lkey.second < rkey.second)
                ++lit;
            else
                ++rit;
        }
    }
    return result;
}